

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool c4::from_chars(csubstr buf,raw_wrapper *r)

{
  bool bVar1;
  error_flags eVar2;
  void *__src;
  undefined8 *in_RDX;
  long in_RSI;
  void *in_RDI;
  char *ptr;
  size_t space;
  void *vptr;
  size_t local_38;
  void *local_30;
  undefined8 *local_28;
  void *local_20;
  long local_18;
  void **local_10;
  void **local_8;
  
  local_28 = in_RDX;
  local_20 = in_RDI;
  local_18 = in_RSI;
  __src = std::align(in_RDX[2],in_RDX[1],&local_30,&local_38);
  if (__src == (void *)0x0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x3fa1ef,(char *)0x4307,"check failed: %s","ptr != nullptr");
  }
  local_10 = &local_20;
  if (local_20 <= __src) {
    local_8 = &local_20;
  }
  if (local_20 > __src || (void *)((long)local_20 + local_18) < __src) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x3fa1ef,(char *)0x4308,"check failed: %s","ptr >= buf.begin() && ptr <= buf.end()"
                );
  }
  memcpy((void *)*local_28,__src,local_28[1]);
  return true;
}

Assistant:

bool from_chars(csubstr buf, fmt::raw_wrapper *r)
{
    void * vptr = (void*)buf.str;
    size_t space = buf.len;
    auto ptr = (decltype(buf.str)) std::align(r->alignment, r->len, vptr, space);
    C4_CHECK(ptr != nullptr);
    C4_CHECK(ptr >= buf.begin() && ptr <= buf.end());
    //size_t dim = (ptr - buf.str) + r->len;
    memcpy(r->buf, ptr, r->len);
    return true;
}